

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

void __thiscall
soul::SimpleTokeniser::SimpleTokeniser
          (SimpleTokeniser *this,CodeLocation *start,bool ignoreComments)

{
  (this->super_SOULTokeniser).startLocation.sourceCode.object = (SourceCodeText *)0x0;
  (this->super_SOULTokeniser).startLocation.location.data = (char *)0x0;
  (this->super_SOULTokeniser).location.sourceCode.object = (SourceCodeText *)0x0;
  (this->super_SOULTokeniser).location.location.data = (char *)0x0;
  (this->super_SOULTokeniser).currentType.text = (char *)0x0;
  (this->super_SOULTokeniser).literalIntValue = 0;
  (this->super_SOULTokeniser).literalDoubleValue = 0.0;
  (this->super_SOULTokeniser).currentStringValue._M_dataplus._M_p =
       (pointer)&(this->super_SOULTokeniser).currentStringValue.field_2;
  (this->super_SOULTokeniser).currentStringValue._M_string_length = 0;
  (this->super_SOULTokeniser).currentStringValue.field_2._M_local_buf[0] = '\0';
  (this->super_SOULTokeniser).input.data = (char *)0x0;
  (this->super_SOULTokeniser).literalType.text = (char *)0x0;
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)&PTR__Tokeniser_00307a18;
  (this->super_SOULTokeniser).shouldIgnoreComments = ignoreComments;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::initialise(&this->super_SOULTokeniser,start);
  return;
}

Assistant:

SimpleTokeniser (const CodeLocation& start, bool ignoreComments)
    {
        shouldIgnoreComments = ignoreComments;
        initialise (start);
    }